

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O2

string * __thiscall
deqp::gles31::Functional::(anonymous_namespace)::SingleSampleInterpolateAtSampleCase::
genFragmentSource_abi_cxx11_(string *__return_storage_ptr__,void *this,int numTargetSamples)

{
  char *pcVar1;
  ostringstream buf;
  ContextType local_1b4;
  string local_1b0;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::operator<<(&local_190,
                  "${GLSL_VERSION_DECL}\n${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}in highp vec2 v_position;\nlayout(location = 0) out mediump vec4 fragColor;\nvoid main (void)\n{\n\tconst highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n"
                 );
  if (*(int *)((long)this + 0x128) == 1) {
    pcVar1 = 
    "\tbool allOk = true;\n\tfor (int sampleNdx = 159; sampleNdx < 163; ++sampleNdx)\n\t{\n\t\thighp vec2 samplePosition = interpolateAtSample(v_position, sampleNdx);\n\t\thighp vec2 positionInsideAPixel = fract(samplePosition);\n\t\tif (abs(positionInsideAPixel.x - 0.5) > threshold || abs(positionInsideAPixel.y - 0.5) > threshold)\n\t\t\tallOk = false;\n\t}\n\n\tif (allOk)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
    ;
  }
  else {
    if (*(int *)((long)this + 0x128) != 0) goto LAB_0123711e;
    pcVar1 = 
    "\thighp vec2 samplePosition = interpolateAtSample(v_position, 0);\n\thighp vec2 positionInsideAPixel = fract(samplePosition);\n\n\tif (abs(positionInsideAPixel.x - 0.5) <= threshold && abs(positionInsideAPixel.y - 0.5) <= threshold)\n\t\tfragColor = vec4(0.0, 1.0, 0.0, 1.0);\n\telse\n\t\tfragColor = vec4(1.0, 0.0, 0.0, 1.0);\n}\n"
    ;
  }
  std::operator<<(&local_190,pcVar1);
LAB_0123711e:
  std::__cxx11::stringbuf::str();
  local_1b4.super_ApiType.m_bits =
       (ApiType)(**(code **)(**(long **)(*(long *)((long)this + 0x70) + 8) + 0x10))();
  anon_unknown_2::specializeShader(__return_storage_ptr__,&local_1b0,&local_1b4);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string SingleSampleInterpolateAtSampleCase::genFragmentSource (int numTargetSamples) const
{
	DE_UNREF(numTargetSamples);

	std::ostringstream buf;

	buf <<	"${GLSL_VERSION_DECL}\n"
			"${GLSL_EXT_SHADER_MULTISAMPLE_INTERPOLATION}"
			"in highp vec2 v_position;\n"
			"layout(location = 0) out mediump vec4 fragColor;\n"
			"void main (void)\n"
			"{\n"
			"	const highp float threshold = 0.15625; // 4 subpixel bits. Assume 3 accurate bits + 0.03125 for other errors\n"; // 0.03125 = mediump epsilon when value = 32 (RENDER_SIZE)

	if (m_sampleCase == SAMPLE_0)
	{
		buf <<	"	highp vec2 samplePosition = interpolateAtSample(v_position, 0);\n"
				"	highp vec2 positionInsideAPixel = fract(samplePosition);\n"
				"\n"
				"	if (abs(positionInsideAPixel.x - 0.5) <= threshold && abs(positionInsideAPixel.y - 0.5) <= threshold)\n"
				"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
				"	else\n"
				"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"}\n";
	}
	else if (m_sampleCase == SAMPLE_N)
	{
		buf <<	"	bool allOk = true;\n"
				"	for (int sampleNdx = 159; sampleNdx < 163; ++sampleNdx)\n"
				"	{\n"
				"		highp vec2 samplePosition = interpolateAtSample(v_position, sampleNdx);\n"
				"		highp vec2 positionInsideAPixel = fract(samplePosition);\n"
				"		if (abs(positionInsideAPixel.x - 0.5) > threshold || abs(positionInsideAPixel.y - 0.5) > threshold)\n"
				"			allOk = false;\n"
				"	}\n"
				"\n"
				"	if (allOk)\n"
				"		fragColor = vec4(0.0, 1.0, 0.0, 1.0);\n"
				"	else\n"
				"		fragColor = vec4(1.0, 0.0, 0.0, 1.0);\n"
				"}\n";
	}
	else
		DE_ASSERT(false);

	return specializeShader(buf.str(), m_context.getRenderContext().getType());
}